

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.cpp
# Opt level: O3

void __thiscall
rudp::session::session
          (session *this,io_service *ios,socket *sock,endpoint *endpoint_,
          function<void_(const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_&)> *on_closed_
          )

{
  undefined8 *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  uint32_t uVar5;
  long lVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  
  (this->super_enable_shared_from_this<rudp::session>)._M_weak_this.
  super___weak_ptr<rudp::session,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<rudp::session>)._M_weak_this.
  super___weak_ptr<rudp::session,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->io_service = ios;
  this->socket = sock;
  uVar2 = *(undefined8 *)((long)&(endpoint_->impl_).data_ + 8);
  uVar3 = *(undefined8 *)((long)&(endpoint_->impl_).data_ + 0xc);
  uVar4 = *(undefined8 *)((long)&(endpoint_->impl_).data_ + 0x14);
  *(undefined8 *)&(this->endpoint).impl_.data_ = *(undefined8 *)&(endpoint_->impl_).data_;
  *(undefined8 *)((long)&(this->endpoint).impl_.data_ + 8) = uVar2;
  *(undefined8 *)((long)&(this->endpoint).impl_.data_ + 0xc) = uVar3;
  *(undefined8 *)((long)&(this->endpoint).impl_.data_ + 0x14) = uVar4;
  (this->self_config).max_out_of_standing_segs = '@';
  (this->self_config).option_flags = '\x02';
  (this->self_config).maximum_segment_size = 0x546;
  (this->self_config).retransmission_timeout_value = 1000;
  (this->self_config).cumulative_ack_timeout_value = 500;
  (this->self_config).null_segment_timeout_value = 1000;
  (this->self_config).transfer_state_timeout_value = 1000;
  (this->self_config).max_retrans = '\x03';
  (this->self_config).max_cum_ack = ' ';
  (this->self_config).max_out_of_seq = ' ';
  (this->self_config).max_auto_reset = '\0';
  uVar5 = rand();
  (this->self_config).connection_identifier = uVar5;
  (this->remote_config).max_out_of_standing_segs = '@';
  (this->remote_config).option_flags = '\x02';
  (this->remote_config).maximum_segment_size = 0x546;
  (this->remote_config).retransmission_timeout_value = 1000;
  (this->remote_config).cumulative_ack_timeout_value = 500;
  (this->remote_config).null_segment_timeout_value = 1000;
  (this->remote_config).transfer_state_timeout_value = 1000;
  (this->remote_config).max_retrans = '\x03';
  (this->remote_config).max_cum_ack = ' ';
  (this->remote_config).max_out_of_seq = ' ';
  (this->remote_config).max_auto_reset = '\0';
  uVar5 = rand();
  (this->remote_config).connection_identifier = uVar5;
  (this->pending).c.
  super__Deque_base<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>,_std::allocator<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->pending).c.
  super__Deque_base<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>,_std::allocator<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->pending).c.
  super__Deque_base<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>,_std::allocator<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->pending).c.
  super__Deque_base<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>,_std::allocator<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->pending).c.
  super__Deque_base<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>,_std::allocator<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->pending).c.
  super__Deque_base<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>,_std::allocator<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->pending).c.
  super__Deque_base<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>,_std::allocator<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->pending).c.
  super__Deque_base<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>,_std::allocator<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->pending).c.
  super__Deque_base<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>,_std::allocator<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->pending).c.
  super__Deque_base<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>,_std::allocator<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  memset(&this->receive_buffer,0,0x1001);
  memset(&this->send_buffer,0,0x3002);
  std::
  _Deque_base<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>,_std::allocator<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>_>_>
  ::_M_initialize_map((_Deque_base<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>,_std::allocator<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>_>_>
                       *)&this->pending,0);
  memset(&this->cumulative_ack_count,0,0x183d);
  std::function<void_(const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_&)>::function
            (&this->on_closed,on_closed_);
  a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_01 = &(this->receive_buffer)._M_elems[0].
             super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount;
  lVar6 = 0x1000;
  do {
    ((__shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
      *)(this_01 + -1))->_M_ptr = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(this_01,a_Stack_40);
    this_01 = this_01 + 2;
    lVar6 = lVar6 + -0x10;
  } while (lVar6 != 0);
  if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
  }
  lVar6 = 0;
  do {
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               ((long)&(this->send_buffer)._M_elems[0].first.
                       super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi + lVar6);
    puVar1 = (undefined8 *)
             ((long)&(this->send_buffer)._M_elems[0].first.
                     super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr + lVar6);
    *puVar1 = 0;
    puVar1[1] = 0;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    lVar6 = lVar6 + 0x30;
  } while (lVar6 != 0x3000);
  lVar6 = 0;
  do {
    *(undefined8 *)((long)&(this->retransmission_timer)._M_elems[0].second + lVar6) = 0;
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x1800);
  return;
}

Assistant:

session::session(
    boost::asio::io_service &ios,
    boost::asio::ip::udp::socket &sock,
    const boost::asio::ip::udp::endpoint &endpoint_,
    const std::function< void( const boost::asio::ip::udp::endpoint& ) > &on_closed_
  ) : io_service( ios ), socket( sock ), endpoint( endpoint_ ), receive_head( 0 ), send_head( 0 ), acknowledge_head( 0 ), cumulative_ack_count( 0 ), state( session_state::initial ), client( false ), on_closed( on_closed_ ) {
    std::fill( receive_buffer.begin(), receive_buffer.end(), buffer_ptr_t() );
    std::for_each( send_buffer.begin(), send_buffer.end(), []    ( auto &v ) { v.first = buffer_ptr_t(); } );
    std::for_each( retransmission_timer.begin(), retransmission_timer.end(), []( auto &v ) { v.second = 0u; } );
  }